

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenu.cpp
# Opt level: O0

void __thiscall QMenu::setDefaultAction(QMenu *this,QAction *act)

{
  QAction *in_RSI;
  QAction *this_00;
  
  this_00 = in_RSI;
  d_func((QMenu *)0x646be5);
  QPointer<QAction>::operator=((QPointer<QAction> *)this_00,in_RSI);
  return;
}

Assistant:

void QMenu::setDefaultAction(QAction *act)
{
    d_func()->defaultAction = act;
}